

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

uc_err uc_mem_read(uc_engine *uc,uint64_t address,void *_bytes,size_t size)

{
  _Bool _Var1;
  uc_err uVar2;
  MemoryRegion *pMVar3;
  hwaddr hVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (((uc->init_done != false) || (uVar2 = uc_init_engine(uc), uVar2 == UC_ERR_OK)) &&
     (uVar2 = UC_ERR_ARG, size < 0x80000000)) {
    _Var1 = check_mem_area(uc,address,size);
    uVar2 = UC_ERR_READ_UNMAPPED;
    if (_Var1) {
      if (size == 0) {
        sVar6 = 0;
      }
      else {
        sVar6 = 0;
        do {
          pMVar3 = (*uc->memory_mapping)(uc,address);
          if (pMVar3 == (MemoryRegion *)0x0) break;
          hVar4 = pMVar3->end;
          for (pMVar3 = pMVar3->container; pMVar3 != uc->system_memory; pMVar3 = pMVar3->container)
          {
            hVar4 = hVar4 + pMVar3->addr;
          }
          uVar5 = hVar4 - address;
          if (size - sVar6 <= hVar4 - address) {
            uVar5 = size - sVar6;
          }
          _Var1 = (*uc->read_mem)(&uc->address_space_memory,address,(uint8_t *)_bytes,(int)uVar5);
          if (!_Var1) break;
          sVar6 = sVar6 + uVar5;
          address = address + uVar5;
          _bytes = (void *)((long)_bytes + uVar5);
        } while (sVar6 < size);
      }
      uVar2 = UC_ERR_READ_UNMAPPED;
      if (sVar6 == size) {
        uVar2 = UC_ERR_OK;
      }
    }
  }
  return uVar2;
}

Assistant:

UNICORN_EXPORT
uc_err uc_mem_read(uc_engine *uc, uint64_t address, void *_bytes, size_t size)
{
    size_t count = 0, len;
    uint8_t *bytes = _bytes;

    UC_INIT(uc);

    // qemu cpu_physical_memory_rw() size is an int
    if (size > INT_MAX)
        return UC_ERR_ARG;

    if (!check_mem_area(uc, address, size)) {
        return UC_ERR_READ_UNMAPPED;
    }

    // memory area can overlap adjacent memory blocks
    while (count < size) {
        MemoryRegion *mr = uc->memory_mapping(uc, address);
        if (mr) {
            len = memory_region_len(uc, mr, address, size - count);
            if (uc->read_mem(&uc->address_space_memory, address, bytes, len) ==
                false) {
                break;
            }
            count += len;
            address += len;
            bytes += len;
        } else { // this address is not mapped in yet
            break;
        }
    }

    if (count == size) {
        return UC_ERR_OK;
    } else {
        return UC_ERR_READ_UNMAPPED;
    }
}